

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::currCC(Graph<Node> *this,vector<int> *cc,vector<bool> *used,int *node)

{
  int iVar1;
  NodeList<Node> *pNVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long lVar4;
  int nxtNode;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  vector<int>::push_back(cc,node);
  uVar3 = (ulong)*node;
  used->vect[uVar3] = true;
  lVar4 = 0;
  while( true ) {
    pNVar2 = (this->G).vect;
    if (pNVar2[(int)uVar3].nodes._size <= lVar4) break;
    iVar1 = pNVar2[(int)uVar3].nodes.vect[lVar4]._index;
    uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
    if (used->vect[iVar1] == false) {
      currCC(this,cc,used,(int *)((long)&uStack_38 + 4));
      uVar3 = (ulong)(uint)*node;
    }
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void currCC(vector <int> &cc, vector <bool> &used, const int &node) {
        cc.push_back(node);
        used[node] = true;

        for (int nxtInd = 0; nxtInd < G[node].size(); ++nxtInd) {
            int nxtNode = G[node][nxtInd].getIndex();

            if (!used[nxtNode]) {
                currCC(cc, used, nxtNode);
            }
        }
    }